

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

char * Ses_ManFindMinimumSize(Ses_Man_t *pSes)

{
  int iVar1;
  uint local_24;
  int fRes;
  int i;
  char *pSol;
  Ses_Man_t *pSes_local;
  
  _fRes = (Ses_Man_t *)0x0;
  local_24 = pSes->nStartGates;
  if (pSes->nSpecFunc < 2) {
    if ((pSes->nMaxDepth != -1) && (pSes->pArrTimeProfile != (int *)0x0)) {
      iVar1 = Ses_CheckDepthConsistency(pSes);
      if (iVar1 == 0) {
        return (char *)0x0;
      }
      Ses_ManComputeMaxGates(pSes);
    }
    pSes_local = (Ses_Man_t *)Ses_ManFindMinimumSizeBottomUp(pSes);
    if ((((pSes_local == (Ses_Man_t *)0x0) && (pSes->nMaxDepth != -1)) && (pSes->fHitResLimit != 0))
       && (pSes->nGates != pSes->nMaxGates)) {
      pSes_local = (Ses_Man_t *)Ses_ManFindMinimumSizeTopDown(pSes,pSes->nGates + 1);
    }
  }
  else {
    do {
      local_24 = local_24 + 1;
      if (pSes->fVerbose != 0) {
        printf("try with %d gates\n",(ulong)local_24);
      }
      memset(pSes->pTtValues,0xff,0x20);
      iVar1 = Ses_ManFindNetworkExact(pSes,local_24);
    } while (iVar1 == 2);
    if (iVar1 != 0) {
      _fRes = (Ses_Man_t *)Ses_ManExtractSolution(pSes);
    }
    pSes_local = _fRes;
  }
  return (char *)pSes_local;
}

Assistant:

static char * Ses_ManFindMinimumSize( Ses_Man_t * pSes )
{
    char * pSol = NULL;
    int i = pSes->nStartGates + 1, fRes;

    /* if more than one function, no CEGAR */
    if ( pSes->nSpecFunc > 1 )
    {
      while ( true )
      {
        if ( pSes->fVerbose )
        {
          printf( "try with %d gates\n", i );
        }

        memset( pSes->pTtValues, ~0, 4 * sizeof( word ) );
        fRes = Ses_ManFindNetworkExact( pSes, i++ );
        if ( fRes == 2 ) continue;
        if ( fRes == 0 ) break;

        pSol = Ses_ManExtractSolution( pSes );
        break;
      }

      return pSol;
    }

    /* do the arrival times allow for a network? */
    if ( pSes->nMaxDepth != -1 && pSes->pArrTimeProfile )
    {
        if ( !Ses_CheckDepthConsistency( pSes ) )
            return 0;
        Ses_ManComputeMaxGates( pSes );
    }

    pSol = Ses_ManFindMinimumSizeBottomUp( pSes );

    if ( !pSol && pSes->nMaxDepth != -1 && pSes->fHitResLimit && pSes->nGates != pSes->nMaxGates )
        return Ses_ManFindMinimumSizeTopDown( pSes, pSes->nGates + 1 );
    else
        return pSol;
}